

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixInstance::addMatrixUniform
          (ShaderMatrixInstance *this,deUint32 bindingLocation,DataType dataType,float *dataPtr)

{
  float *data;
  Array<float,_16> local_3a8;
  Vector<float,_4> local_368;
  Vector<float,_4> local_358;
  Vector<float,_4> local_348;
  Vector<float,_4> local_338;
  undefined1 local_328 [8];
  Mat4 matrix_8;
  Vector<float,_4> local_2d8;
  Vector<float,_4> local_2c8;
  Vector<float,_4> local_2b8;
  undefined1 local_2a8 [8];
  Mat4x3 matrix_7;
  Vector<float,_4> local_268;
  Vector<float,_4> local_258;
  Vector<float,_4> local_248;
  undefined1 local_238 [8];
  Mat4x2 matrix_6;
  Vector<float,_4> local_208;
  Vector<float,_4> local_1f8;
  undefined1 local_1e8 [8];
  Mat3x4 matrix_5;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  undefined1 local_188 [8];
  Mat3 matrix_4;
  Vector<float,_4> local_154;
  Vector<float,_4> local_144;
  undefined1 local_134 [8];
  Mat3x2 matrix_3;
  Vector<float,_4> local_10c;
  undefined1 local_fc [8];
  Mat2x4 matrix_2;
  Vector<float,_4> local_cc;
  undefined1 local_bc [8];
  Mat2x3 matrix_1;
  Vector<float,_4> local_94;
  undefined1 local_78 [8];
  Mat2 matrix;
  size_t matrixSize;
  Mat4 result;
  float *dataPtr_local;
  DataType dataType_local;
  deUint32 bindingLocation_local;
  ShaderMatrixInstance *this_local;
  
  result.m_data.m_data[3].m_data._8_8_ = dataPtr;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&matrixSize);
  matrix.m_data.m_data[1].m_data[0] = 8.96831e-44;
  matrix.m_data.m_data[1].m_data[1] = 0.0;
  switch(dataType) {
  case TYPE_FLOAT_MAT2:
    tcu::Matrix<float,_2,_2>::Matrix
              ((Matrix<float,_2,_2> *)local_78,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_2,_2>::getColumn((Matrix<float,_2,_2> *)local_78,0);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)&local_94);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_94);
    tcu::Matrix<float,_2,_2>::getColumn((Matrix<float,_2,_2> *)local_78,1);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)(matrix_1.m_data.m_data[1].m_data + 1));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,1,
               (Vector<float,_4> *)(matrix_1.m_data.m_data[1].m_data + 1));
    tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_78);
    break;
  case TYPE_FLOAT_MAT2X3:
    tcu::Matrix<float,_3,_2>::Matrix
              ((Matrix<float,_3,_2> *)local_bc,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_3,_2>::getColumn((Matrix<float,_3,_2> *)local_bc,0);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)&local_cc);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_cc);
    tcu::Matrix<float,_3,_2>::getColumn((Matrix<float,_3,_2> *)local_bc,1);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)(matrix_2.m_data.m_data[1].m_data + 2));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,1,
               (Vector<float,_4> *)(matrix_2.m_data.m_data[1].m_data + 2));
    tcu::Matrix<float,_3,_2>::~Matrix((Matrix<float,_3,_2> *)local_bc);
    break;
  case TYPE_FLOAT_MAT2X4:
    tcu::Matrix<float,_4,_2>::Matrix
              ((Matrix<float,_4,_2> *)local_fc,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_4,_2>::getColumn((Matrix<float,_4,_2> *)local_fc,0);
    tcu::Vector<float,_4>::toWidth<4>(&local_10c);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_10c);
    tcu::Matrix<float,_4,_2>::getColumn((Matrix<float,_4,_2> *)local_fc,1);
    tcu::Vector<float,_4>::toWidth<4>((Vector<float,_4> *)(matrix_3.m_data.m_data + 2));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,1,(Vector<float,_4> *)(matrix_3.m_data.m_data + 2)
              );
    tcu::Matrix<float,_4,_2>::~Matrix((Matrix<float,_4,_2> *)local_fc);
    break;
  case TYPE_FLOAT_MAT3X2:
    tcu::Matrix<float,_2,_3>::Matrix
              ((Matrix<float,_2,_3> *)local_134,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_2,_3>::getColumn((Matrix<float,_2,_3> *)local_134,0);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)&local_144);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_144);
    tcu::Matrix<float,_2,_3>::getColumn((Matrix<float,_2,_3> *)local_134,1);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)&local_154);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,1,&local_154);
    tcu::Matrix<float,_2,_3>::getColumn((Matrix<float,_2,_3> *)local_134,2);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)(matrix_4.m_data.m_data[2].m_data + 1));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,2,
               (Vector<float,_4> *)(matrix_4.m_data.m_data[2].m_data + 1));
    tcu::Matrix<float,_2,_3>::~Matrix((Matrix<float,_2,_3> *)local_134);
    break;
  case TYPE_FLOAT_MAT3:
    tcu::Matrix<float,_3,_3>::Matrix
              ((Matrix<float,_3,_3> *)local_188,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_3,_3>::getColumn((Matrix<float,_3,_3> *)local_188,0);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)&local_198);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_198);
    tcu::Matrix<float,_3,_3>::getColumn((Matrix<float,_3,_3> *)local_188,1);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)&local_1a8);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,1,&local_1a8);
    tcu::Matrix<float,_3,_3>::getColumn((Matrix<float,_3,_3> *)local_188,2);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)(matrix_5.m_data.m_data[2].m_data + 2));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,2,
               (Vector<float,_4> *)(matrix_5.m_data.m_data[2].m_data + 2));
    tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_188);
    break;
  case TYPE_FLOAT_MAT3X4:
    tcu::Matrix<float,_4,_3>::Matrix
              ((Matrix<float,_4,_3> *)local_1e8,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_4,_3>::getColumn((Matrix<float,_4,_3> *)local_1e8,0);
    tcu::Vector<float,_4>::toWidth<4>(&local_1f8);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_1f8);
    tcu::Matrix<float,_4,_3>::getColumn((Matrix<float,_4,_3> *)local_1e8,1);
    tcu::Vector<float,_4>::toWidth<4>(&local_208);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,1,&local_208);
    tcu::Matrix<float,_4,_3>::getColumn((Matrix<float,_4,_3> *)local_1e8,2);
    tcu::Vector<float,_4>::toWidth<4>((Vector<float,_4> *)(matrix_6.m_data.m_data + 3));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,2,(Vector<float,_4> *)(matrix_6.m_data.m_data + 3)
              );
    tcu::Matrix<float,_4,_3>::~Matrix((Matrix<float,_4,_3> *)local_1e8);
    break;
  case TYPE_FLOAT_MAT4X2:
    tcu::Matrix<float,_2,_4>::Matrix
              ((Matrix<float,_2,_4> *)local_238,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_2,_4>::getColumn((Matrix<float,_2,_4> *)local_238,0);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)&local_248);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_248);
    tcu::Matrix<float,_2,_4>::getColumn((Matrix<float,_2,_4> *)local_238,1);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)&local_258);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,1,&local_258);
    tcu::Matrix<float,_2,_4>::getColumn((Matrix<float,_2,_4> *)local_238,2);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)&local_268);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,2,&local_268);
    tcu::Matrix<float,_2,_4>::getColumn((Matrix<float,_2,_4> *)local_238,3);
    tcu::Vector<float,_2>::toWidth<4>((Vector<float,_2> *)(matrix_7.m_data.m_data[3].m_data + 1));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,3,
               (Vector<float,_4> *)(matrix_7.m_data.m_data[3].m_data + 1));
    tcu::Matrix<float,_2,_4>::~Matrix((Matrix<float,_2,_4> *)local_238);
    break;
  case TYPE_FLOAT_MAT4X3:
    tcu::Matrix<float,_3,_4>::Matrix
              ((Matrix<float,_3,_4> *)local_2a8,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_3,_4>::getColumn((Matrix<float,_3,_4> *)local_2a8,0);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)&local_2b8);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_2b8);
    tcu::Matrix<float,_3,_4>::getColumn((Matrix<float,_3,_4> *)local_2a8,1);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)&local_2c8);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,1,&local_2c8);
    tcu::Matrix<float,_3,_4>::getColumn((Matrix<float,_3,_4> *)local_2a8,2);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)&local_2d8);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,2,&local_2d8);
    tcu::Matrix<float,_3,_4>::getColumn((Matrix<float,_3,_4> *)local_2a8,3);
    tcu::Vector<float,_3>::toWidth<4>((Vector<float,_3> *)(matrix_8.m_data.m_data[3].m_data + 2));
    tcu::Matrix<float,_4,_4>::setColumn
              ((Matrix<float,_4,_4> *)&matrixSize,3,
               (Vector<float,_4> *)(matrix_8.m_data.m_data[3].m_data + 2));
    tcu::Matrix<float,_3,_4>::~Matrix((Matrix<float,_3,_4> *)local_2a8);
    break;
  case TYPE_FLOAT_MAT4:
    tcu::Matrix<float,_4,_4>::Matrix
              ((Matrix<float,_4,_4> *)local_328,(float *)result.m_data.m_data[3].m_data._8_8_);
    tcu::Matrix<float,_4,_4>::getColumn((Matrix<float,_4,_4> *)local_328,0);
    tcu::Vector<float,_4>::toWidth<4>(&local_338);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,0,&local_338);
    tcu::Matrix<float,_4,_4>::getColumn((Matrix<float,_4,_4> *)local_328,1);
    tcu::Vector<float,_4>::toWidth<4>(&local_348);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,1,&local_348);
    tcu::Matrix<float,_4,_4>::getColumn((Matrix<float,_4,_4> *)local_328,2);
    tcu::Vector<float,_4>::toWidth<4>(&local_358);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,2,&local_358);
    tcu::Matrix<float,_4,_4>::getColumn((Matrix<float,_4,_4> *)local_328,3);
    tcu::Vector<float,_4>::toWidth<4>(&local_368);
    tcu::Matrix<float,_4,_4>::setColumn((Matrix<float,_4,_4> *)&matrixSize,3,&local_368);
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_328);
  }
  tcu::Matrix<float,_4,_4>::getColumnMajorData(&local_3a8,(Matrix<float,_4,_4> *)&matrixSize);
  data = tcu::Array<float,_16>::getPtr(&local_3a8);
  ShaderRenderCaseInstance::addUniform
            (&this->super_ShaderRenderCaseInstance,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER
             ,0x40,data);
  tcu::Array<float,_16>::~Array(&local_3a8);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&matrixSize);
  return;
}

Assistant:

void ShaderMatrixInstance::addMatrixUniform(deUint32 bindingLocation, DataType dataType, const float *dataPtr)
{
	Mat4			result;
	const size_t	matrixSize = sizeof(float) * 4 * 4;

	switch(dataType)
	{
		case TYPE_FLOAT_MAT2:
		{
			Mat2 matrix = Mat2(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT2X3:
		{
			Mat2x3 matrix = Mat2x3(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT2X4:
		{
			Mat2x4 matrix = Mat2x4(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT3X2:
		{
			Mat3x2 matrix = Mat3x2(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT3:
		{
			Mat3 matrix = Mat3(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT3X4:
		{
			Mat3x4 matrix = Mat3x4(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT4X2:
		{
			Mat4x2 matrix = Mat4x2(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			result.setColumn(3, matrix.getColumn(3).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT4X3:
		{
			Mat4x3 matrix = Mat4x3(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			result.setColumn(3, matrix.getColumn(3).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT4:
		{
			Mat4 matrix = Mat4(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			result.setColumn(3, matrix.getColumn(3).toWidth<4>());
			break;
		}
		default:
			DE_ASSERT(false);
			break;
	}

	addUniform(bindingLocation, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, matrixSize, result.getColumnMajorData().getPtr());
}